

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CETime.cpp
# Opt level: O0

void __thiscall
CETime::SetTime(CETime *this,vector<double,_std::allocator<double>_> *time_vect,
               CETimeType time_format)

{
  int in_EDX;
  CETime *in_RDI;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff48;
  vector<double,_std::allocator<double>_> *pvVar1;
  CETime *in_stack_ffffffffffffff50;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff60;
  vector<double,_std::allocator<double>_> local_88;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff98;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa0;
  vector<double,_std::allocator<double>_> local_58;
  vector<double,_std::allocator<double>_> local_30 [2];
  
  if (in_EDX == 0) {
    pvVar1 = local_30;
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    SetTime_UTC(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    std::vector<double,_std::allocator<double>_>::~vector(pvVar1);
  }
  else if (in_EDX == 1) {
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    SetTime_GAST(in_RDI,&local_58);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffff60);
  }
  else if (in_EDX == 2) {
    pvVar1 = (vector<double,_std::allocator<double>_> *)&stack0xffffffffffffff90;
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    SetTime_LST(in_RDI,pvVar1);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffff60);
  }
  else if (in_EDX == 3) {
    pvVar1 = &local_88;
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    SetTime_LOCALTIME(in_RDI,pvVar1);
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffff60);
  }
  return;
}

Assistant:

void CETime::SetTime(std::vector<double> time_vect, CETimeType time_format)
{
    // Convert the double into a vector
    if (time_format==CETimeType::UTC) {
        SetTime_UTC(time_vect) ;
    } else if (time_format==CETimeType::GAST) {
        SetTime_GAST(time_vect) ;
    } else if (time_format==CETimeType::LAST) {
        SetTime_LST(time_vect) ;
    } else if (time_format==CETimeType::LOCALTIME) {
        SetTime_LOCALTIME(time_vect) ;
    }
}